

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::AttributeCase::iterate(AttributeCase *this)

{
  TestLog *log;
  ResultCollector result;
  allocator<char> local_81;
  string local_80;
  ResultCollector local_60;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80," // ERROR: ",&local_81);
  tcu::ResultCollector::ResultCollector(&local_60,log,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,&local_60);
  tcu::ResultCollector::setTestContextResult
            (&local_60,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&local_60);
  return STOP;
}

Assistant:

AttributeCase::IterateResult AttributeCase::iterate (void)
{
	tcu::ResultCollector result(m_testCtx.getLog(), " // ERROR: ");

	test(result);

	result.setTestContextResult(m_testCtx);
	return STOP;
}